

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

int lws_ssl_capable_write_no_ssl(lws *wsi,uchar *buf,int len)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  ssize_t sVar4;
  int *piVar5;
  lws_udp *__addr;
  socklen_t __addr_len;
  uint uVar6;
  uint16_t u16;
  ushort local_2a;
  
  if (wsi->udp == (lws_udp *)0x0) {
    if ((wsi->role_ops->field_0xc8 & 1) == 0) {
      sVar4 = send((wsi->desc).sockfd,buf,(long)len,0x4000);
      uVar6 = (uint)sVar4;
    }
    else {
      sVar4 = write((wsi->desc).sockfd,buf,(long)len);
      uVar6 = (uint)sVar4;
    }
  }
  else {
    if (wsi->context->udp_loss_sim_tx_pc != '\0') {
      sVar3 = lws_get_random(wsi->context,&local_2a,2);
      bVar1 = true;
      uVar6 = 0;
      if ((sVar3 == 2) &&
         (((uint)local_2a * 100) / 0xffff <= (uint)wsi->context->udp_loss_sim_tx_pc)) {
        bVar1 = false;
        _lws_log(2,"%s: dropping udp tx\n","lws_ssl_capable_write_no_ssl");
        uVar6 = len;
      }
      if (!bVar1) goto LAB_00111046;
    }
    __addr = wsi->udp;
    if (wsi->buflist_out == (lws_buflist *)0x0) {
      __addr_len = __addr->salen;
    }
    else {
      __addr_len = __addr->salen_pending;
      __addr = (lws_udp *)&__addr->sa_pending;
    }
    sVar4 = sendto((wsi->desc).sockfd,buf,(long)len,0,(sockaddr *)__addr,__addr_len);
    uVar6 = (uint)sVar4;
  }
LAB_00111046:
  uVar2 = uVar6;
  if ((int)uVar6 < 0) {
    piVar5 = __errno_location();
    uVar2 = 0xfffffffc;
    if ((*piVar5 != 4) && (*piVar5 != 0xb)) {
      _lws_log(0x10,"ERROR writing len %d to skt fd %d err %d / errno %d\n",(ulong)(uint)len,
               (ulong)(uint)(wsi->desc).sockfd,(ulong)uVar6);
      uVar2 = 0xffffffff;
    }
  }
  return uVar2;
}

Assistant:

int
lws_ssl_capable_write_no_ssl(struct lws *wsi, unsigned char *buf, int len)
{
	int n = 0;
#if defined(LWS_PLAT_OPTEE)
	ssize_t send(int sockfd, const void *buf, size_t len, int flags);
#endif

#if defined(LWS_WITH_UDP)
	if (lws_wsi_is_udp(wsi)) {
		if (wsi->context->udp_loss_sim_tx_pc) {
			uint16_t u16;
			/*
			 * We should randomly drop some of these
			 */

			if (lws_get_random(wsi->context, &u16, 2) == 2 &&
			    ((u16 * 100) / 0xffff) <=
				    wsi->context->udp_loss_sim_tx_pc) {
				lwsl_warn("%s: dropping udp tx\n", __func__);
				/* pretend it was sent */
				n = len;
				goto post_send;
			}
		}
		if (lws_has_buffered_out(wsi))
			n = sendto(wsi->desc.sockfd, (const char *)buf,
				   len, 0, &wsi->udp->sa_pending,
				   wsi->udp->salen_pending);
		else
			n = sendto(wsi->desc.sockfd, (const char *)buf,
				   len, 0, &wsi->udp->sa, wsi->udp->salen);
	} else
#endif
		if (wsi->role_ops->file_handle)
			n = write((int)(long long)wsi->desc.filefd, buf, len);
		else
			n = send(wsi->desc.sockfd, (char *)buf, len, MSG_NOSIGNAL);
//	lwsl_info("%s: sent len %d result %d", __func__, len, n);

#if defined(LWS_WITH_UDP)
post_send:
#endif
	if (n >= 0)
		return n;

	if (LWS_ERRNO == LWS_EAGAIN ||
	    LWS_ERRNO == LWS_EWOULDBLOCK ||
	    LWS_ERRNO == LWS_EINTR) {
		if (LWS_ERRNO == LWS_EWOULDBLOCK) {
			lws_set_blocking_send(wsi);
		}

		return LWS_SSL_CAPABLE_MORE_SERVICE;
	}

	lwsl_debug("ERROR writing len %d to skt fd %d err %d / errno %d\n",
		   len, wsi->desc.sockfd, n, LWS_ERRNO);

	return LWS_SSL_CAPABLE_ERROR;
}